

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::TagSet::matches
          (TagSet *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  undefined1 uVar3;
  _Rb_tree_header *p_Var4;
  
  p_Var2 = (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&tags->_M_t,(key_type *)(p_Var2 + 1));
      uVar3 = (_Rb_tree_header *)cVar1._M_node != &(tags->_M_t)._M_impl.super__Rb_tree_header ^
              (char)p_Var2[3]._M_color;
      if (uVar3 != _S_black) {
        return (bool)uVar3;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return true;
}

Assistant:

bool matches( std::set<std::string> const& tags ) const {
            TagMap::const_iterator it = m_tags.begin();
            TagMap::const_iterator itEnd = m_tags.end();
            for(; it != itEnd; ++it ) {
                bool found = tags.find( it->first ) != tags.end();
                if( found == it->second.isNegated() )
                    return false;
            }
            return true;
        }